

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNDely.cpp
# Opt level: O0

void __thiscall NaPNDelay::initialize(NaPNDelay *this,bool *starter)

{
  NaVector *pNVar1;
  NaVector *in_RSI;
  NaPetriCnInput *in_RDI;
  NaVector *unaff_retaddr;
  NaPetriCnInput *pNVar2;
  uint n;
  
  if (((ulong)in_RDI[5].super_NaPetriConnector.pcaLinked.pTail & 0x10000000000) == 0) {
    *(undefined4 *)&in_RDI[5].super_NaPetriConnector.pcaLinked.pTail = 0;
  }
  else {
    *(int *)&in_RDI[5].super_NaPetriConnector.pcaLinked.pTail =
         *(int *)&in_RDI[5].super_NaPetriConnector.pcaLinked.pHead + 1;
  }
  pNVar2 = in_RDI;
  pNVar1 = NaPetriCnInput::data(in_RDI);
  n = (uint)((ulong)pNVar2 >> 0x20);
  (*pNVar1->_vptr_NaVector[6])();
  NaVector::new_dim(unaff_retaddr,n);
  NaVector::init_value(in_RSI,(NaReal)in_RDI);
  return;
}

Assistant:

void
NaPNDelay::initialize (bool& starter)
{
  if(bSleepValue)
    nActiveSleep = nMaxLag + 1;
  else
    nActiveSleep = 0;
  vBuffer.new_dim((1 + nMaxLag) * in.data().dim());
  vBuffer.init_value(fSleepValue);
}